

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.h
# Opt level: O1

bool __thiscall S2Polygon::OwningShape::Init(OwningShape *this,Decoder *decoder)

{
  S2Polygon *__p;
  bool bVar1;
  scalar polygon;
  S2Polygon *local_20;
  
  __p = local_20;
  absl::make_unique<S2Polygon>();
  bVar1 = Decode(local_20,decoder);
  if (bVar1) {
    Shape::Init(&this->super_Shape,local_20);
    local_20 = (S2Polygon *)0x0;
    std::__uniq_ptr_impl<const_S2Polygon,_std::default_delete<const_S2Polygon>_>::reset
              ((__uniq_ptr_impl<const_S2Polygon,_std::default_delete<const_S2Polygon>_> *)
               &this->owned_polygon_,__p);
  }
  if (local_20 != (S2Polygon *)0x0) {
    ~S2Polygon(local_20);
    operator_delete(local_20);
  }
  return bVar1;
}

Assistant:

bool Init(Decoder* decoder) {
      auto polygon = absl::make_unique<S2Polygon>();
      if (!polygon->Decode(decoder)) return false;
      Shape::Init(polygon.get());
      owned_polygon_ = std::move(polygon);
      return true;
    }